

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O3

void __thiscall helics::CommsInterface::setFlag(CommsInterface *this,string_view flag,bool val)

{
  char cVar1;
  char cVar2;
  long *__s;
  size_type __rlen;
  bool bVar3;
  string_view message_00;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __s = (long *)flag._M_str;
  if ((flag._M_len == 0xb) &&
     (*(long *)((long)__s + 3) == 0x65646f6d5f726576 && *__s == 0x6d5f726576726573)) {
    cVar2 = '\0';
    do {
      LOCK();
      cVar1 = (this->operating)._M_base._M_i;
      bVar3 = cVar2 == cVar1;
      if (bVar3) {
        (this->operating)._M_base._M_i = true;
        cVar1 = cVar2;
      }
      cVar2 = cVar1;
      UNLOCK();
      if (bVar3) {
        this->serverMode = val;
        LOCK();
        if ((this->operating)._M_base._M_i == true) {
          (this->operating)._M_base._M_i = false;
        }
        UNLOCK();
        return;
      }
    } while ((this->txStatus)._M_i == STARTUP);
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"unrecognized flag :","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_48,(char *)__s,flag._M_len);
    message_00._M_str = local_48._M_dataplus._M_p;
    message_00._M_len = local_48._M_string_length;
    logWarning(this,message_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CommsInterface::setFlag(std::string_view flag, bool val)
{
    if (flag == "server_mode") {
        setServerMode(val);
    } else {
        std::string message("unrecognized flag :");
        message.append(flag);
        logWarning(message);
    }
}